

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O3

uint32_t defaultGetFoldedValue(UNewTrie *trie,UChar32 start,int32_t offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = start + 0x400;
  do {
    iVar4 = 0x20;
    if ((((trie != (UNewTrie *)0x0) && ((uint)start < 0x110000)) && (trie->isCompacted == '\0')) &&
       (iVar1 = trie->index[(uint)start >> 5], iVar1 != 0)) {
      iVar2 = -iVar1;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      iVar4 = 1;
      if (trie->data[(start & 0x1fU) + iVar2] != *trie->data) {
        return offset;
      }
    }
    start = start + iVar4;
    if (iVar3 <= start) {
      return 0;
    }
  } while( true );
}

Assistant:

static uint32_t U_CALLCONV
defaultGetFoldedValue(UNewTrie *trie, UChar32 start, int32_t offset) {
    uint32_t value, initialValue;
    UChar32 limit;
    UBool inBlockZero;

    initialValue=trie->data[0];
    limit=start+0x400;
    while(start<limit) {
        value=utrie_get32(trie, start, &inBlockZero);
        if(inBlockZero) {
            start+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(value!=initialValue) {
            return (uint32_t)offset;
        } else {
            ++start;
        }
    }
    return 0;
}